

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O3

int xmlNodeGetBaseSafe(xmlDoc *doc,xmlNode *cur,xmlChar **baseOut)

{
  xmlNode *node;
  int iVar1;
  ulong uVar2;
  xmlChar *str1;
  xmlChar *pxVar3;
  long lVar4;
  xmlChar *newbase;
  xmlChar *base;
  xmlChar *local_50;
  undefined4 local_44;
  xmlChar *local_40;
  xmlChar *local_38;
  
  local_50 = (xmlChar *)0x0;
  if (baseOut == (xmlChar **)0x0) {
    return 1;
  }
  *baseOut = (xmlChar *)0x0;
  uVar2 = (ulong)doc | (ulong)cur;
  if (uVar2 == 0) {
    return 1;
  }
  if ((cur != (xmlNode *)0x0) && (cur->type == XML_NAMESPACE_DECL)) {
    return 1;
  }
  if ((doc == (xmlDoc *)0x0) && (doc = cur->doc, doc == (_xmlDoc *)0x0)) {
    local_44 = (undefined4)CONCAT71((int7)(uVar2 >> 8),1);
    doc = (_xmlDoc *)0x0;
LAB_0015073c:
    pxVar3 = (xmlChar *)0x0;
    do {
      if (cur->type == XML_ELEMENT_NODE) {
        iVar1 = xmlNodeGetAttrValue(cur,"base",(xmlChar *)"http://www.w3.org/XML/1998/namespace",
                                    &local_38);
        if (iVar1 < 0) {
          (*xmlFree)(pxVar3);
          return -1;
        }
        if (local_38 != (xmlChar *)0x0) {
          str1 = local_38;
          if (pxVar3 != (xmlChar *)0x0) {
            iVar1 = xmlBuildURISafe(pxVar3,local_38,&local_40);
            (*xmlFree)(local_50);
            (*xmlFree)(local_38);
            str1 = local_40;
            if (iVar1 != 0) {
              return iVar1;
            }
          }
          local_50 = str1;
          iVar1 = xmlStrncmp(str1,(xmlChar *)"http://",7);
          if (((iVar1 == 0) || (iVar1 = xmlStrncmp(str1,(xmlChar *)"ftp://",6), iVar1 == 0)) ||
             (iVar1 = xmlStrncmp(str1,(xmlChar *)"urn:",4), pxVar3 = str1, iVar1 == 0))
          goto LAB_001508b3;
        }
      }
      else if (cur->type == XML_ENTITY_DECL) {
        str1 = pxVar3;
        if (cur[1]._private != (void *)0x0) {
          (*xmlFree)(pxVar3);
          pxVar3 = (xmlChar *)cur[1]._private;
          goto LAB_0015088e;
        }
        break;
      }
      cur = cur->parent;
      str1 = pxVar3;
    } while (cur != (_xmlNode *)0x0);
    if (((char)local_44 != '\0') || (pxVar3 = doc->URL, pxVar3 == (xmlChar *)0x0))
    goto LAB_001508b3;
    if (str1 != (xmlChar *)0x0) {
      iVar1 = xmlBuildURISafe(str1,pxVar3,&local_40);
      (*xmlFree)(local_50);
      str1 = local_40;
      if (iVar1 != 0) {
        return iVar1;
      }
      goto LAB_001508b3;
    }
  }
  else {
    if (doc->type == XML_HTML_DOCUMENT_NODE) {
      node = doc->children;
      do {
        if (node == (xmlNode *)0x0) {
          return 0;
        }
        if (node->name == (xmlChar *)0x0) {
          return 0;
        }
        lVar4 = 0x30;
        if (node->type == XML_ELEMENT_NODE) {
          iVar1 = xmlStrcasecmp(node->name,"html");
          lVar4 = 0x18;
          if ((iVar1 != 0) && (iVar1 = xmlStrcasecmp(node->name,"head"), iVar1 != 0)) {
            iVar1 = xmlStrcasecmp(node->name,"base");
            lVar4 = 0x30;
            if (iVar1 == 0) {
              iVar1 = xmlNodeGetAttrValue(node,"href",(xmlChar *)0x0,&local_50);
              if (iVar1 < 0) {
                return -1;
              }
              str1 = local_50;
              if (local_50 == (xmlChar *)0x0) {
                return 1;
              }
              goto LAB_001508b3;
            }
          }
        }
        node = *(xmlNode **)((long)&node->_private + lVar4);
      } while( true );
    }
    if (cur != (xmlNode *)0x0) {
      local_44 = 0;
      goto LAB_0015073c;
    }
    pxVar3 = doc->URL;
    if (pxVar3 == (xmlChar *)0x0) {
      str1 = (xmlChar *)0x0;
      goto LAB_001508b3;
    }
  }
LAB_0015088e:
  str1 = xmlStrdup(pxVar3);
  if (str1 == (xmlChar *)0x0) {
    return -1;
  }
LAB_001508b3:
  *baseOut = str1;
  return 0;
}

Assistant:

int
xmlNodeGetBaseSafe(const xmlDoc *doc, const xmlNode *cur, xmlChar **baseOut) {
    xmlChar *ret = NULL;
    xmlChar *base, *newbase;
    int res;

    if (baseOut == NULL)
        return(1);
    *baseOut = NULL;
    if ((cur == NULL) && (doc == NULL))
        return(1);
    if ((cur != NULL) && (cur->type == XML_NAMESPACE_DECL))
        return(1);
    if (doc == NULL)
        doc = cur->doc;

    if ((doc != NULL) && (doc->type == XML_HTML_DOCUMENT_NODE)) {
        cur = doc->children;
	while ((cur != NULL) && (cur->name != NULL)) {
	    if (cur->type != XML_ELEMENT_NODE) {
	        cur = cur->next;
		continue;
	    }
	    if (!xmlStrcasecmp(cur->name, BAD_CAST "html")) {
	        cur = cur->children;
		continue;
	    }
	    if (!xmlStrcasecmp(cur->name, BAD_CAST "head")) {
	        cur = cur->children;
		continue;
	    }
	    if (!xmlStrcasecmp(cur->name, BAD_CAST "base")) {
                if (xmlNodeGetAttrValue(cur, BAD_CAST "href", NULL, &ret) < 0)
                    return(-1);
                if (ret == NULL)
                    return(1);
                goto found;
	    }
	    cur = cur->next;
	}
	return(0);
    }

    while (cur != NULL) {
	if (cur->type == XML_ENTITY_DECL) {
	    xmlEntityPtr ent = (xmlEntityPtr) cur;

            if (ent->URI == NULL)
                break;
            xmlFree(ret);
	    ret = xmlStrdup(ent->URI);
            if (ret == NULL)
                return(-1);
            goto found;
	}
	if (cur->type == XML_ELEMENT_NODE) {
	    if (xmlNodeGetAttrValue(cur, BAD_CAST "base", XML_XML_NAMESPACE,
                                    &base) < 0) {
                xmlFree(ret);
                return(-1);
            }
	    if (base != NULL) {
		if (ret != NULL) {
		    res = xmlBuildURISafe(ret, base, &newbase);
                    xmlFree(ret);
                    xmlFree(base);
                    if (res != 0)
                        return(res);
		    ret = newbase;
		} else {
		    ret = base;
		}
		if ((!xmlStrncmp(ret, BAD_CAST "http://", 7)) ||
		    (!xmlStrncmp(ret, BAD_CAST "ftp://", 6)) ||
		    (!xmlStrncmp(ret, BAD_CAST "urn:", 4)))
                    goto found;
	    }
	}
	cur = cur->parent;
    }

    if ((doc != NULL) && (doc->URL != NULL)) {
	if (ret == NULL) {
	    ret = xmlStrdup(doc->URL);
            if (ret == NULL)
                return(-1);
        } else {
            res = xmlBuildURISafe(ret, doc->URL, &newbase);
            xmlFree(ret);
            if (res != 0)
                return(res);
            ret = newbase;
        }
    }

found:
    *baseOut = ret;
    return(0);
}